

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_qp.c
# Opt level: O1

char * cmime_qp_decode(char *line_in,int mode,char esc_char)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char cVar11;
  int iVar12;
  
  sVar2 = strlen(line_in);
  pcVar3 = (char *)malloc(sVar2 + 1);
  iVar10 = (int)sVar2;
  if (iVar10 < 1) {
    iVar12 = 0;
  }
  else {
    iVar4 = 0;
    iVar12 = 0;
    do {
      lVar6 = (long)iVar4;
      cVar7 = line_in[lVar6];
      if (cVar7 == esc_char) {
        iVar9 = (int)((long)iVar4 + 2);
        lVar5 = lVar6;
        if (iVar10 <= iVar9) {
          pcVar3[iVar12] = '\0';
          break;
        }
        for (; (line_in[lVar5 + 1] == ' ' || (line_in[lVar5 + 1] == '\t')); lVar5 = lVar5 + 1) {
        }
        iVar8 = (int)lVar5 + 1;
        if ((line_in[iVar8] == '\r') || (line_in[iVar8] == '\n')) {
          iVar4 = (int)lVar5 + 2;
          if ((iVar4 < iVar10) && ((line_in[iVar4] == '\n' || (line_in[iVar4] == '\r')))) {
            bVar1 = false;
          }
          else {
            bVar1 = false;
            iVar4 = iVar8;
          }
        }
        else {
          if (iVar4 < iVar10 + -1) {
            if (("\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14"
                 [line_in[lVar6 + 1]] != '\x14') &&
               ("\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14"
                [line_in[(long)iVar4 + 2]] != '\x14')) {
              cVar7 = "\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14"
                      [line_in[(long)iVar4 + 2]] +
                      "\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14"
                      [line_in[lVar6 + 1]] * '\x10';
              bVar1 = true;
              iVar4 = iVar9;
              goto LAB_0010ae74;
            }
            puts("invalid character for quoted-printable detected");
          }
          else {
            printf("no chars left!");
          }
          bVar1 = true;
        }
LAB_0010ae74:
        cVar11 = cVar7;
        if (bVar1) goto LAB_0010ae78;
      }
      else {
        cVar11 = cVar7;
        if (cVar7 == '_') {
          cVar11 = ' ';
        }
        if (mode != 1) {
          cVar11 = cVar7;
        }
LAB_0010ae78:
        pcVar3[iVar12] = cVar11;
        iVar12 = iVar12 + 1;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < iVar10);
  }
  pcVar3[iVar12] = '\0';
  return pcVar3;
}

Assistant:

char *cmime_qp_decode(char *line_in, int mode, char esc_char)  {

    char *line_out = NULL;
    char c;                                                     /* output character */
    int opos = 0;                                               /* output positioning */
    int ipos;                                                   /* input positioning */
    int len = strlen(line_in);                                  /* length of inputstring */

    /* we malloc size of line_in char as through decoding string just can get shorter, not longer */
    line_out = malloc(strlen(line_in)+1*sizeof(char));

    /* we now go through every character of the string */                           
    for(ipos = 0; ipos < len; ipos++) {
        c = line_in[ipos];
   
        /* start cracking if we reach the esc char */
        if (c == esc_char) {
            /* check if there are to other chars */
            if((ipos+2)<len) {
                /* remember position */
                int orig_pos = ipos;
                
                /* absorb whitespaces */
                if (1) {
                    char *w = &(line_in[ipos +1]);
                    while ((*w == '\t') || (*w == ' ')) {w++;ipos++;}
                }

                /* check for linebreak */   
                if (( line_in[ipos +1] == '\n') || (line_in[ipos +1] == '\r' )) {
                    ipos++;
                    if ((ipos+1 < len) && (( line_in[ipos +1] == '\n') || (line_in[ipos +1] == '\r' ))) {
                        ipos++;
                    }
                    continue;
                } else {
                    /* go back to origin pos */
                    ipos = orig_pos;
                    /* convert char from hex to dec */
                    if(ipos < len - 1) {
                        if(hexconv[(int)line_in[ipos+1]] == 20 || hexconv[(int)line_in[ipos+2]] == 20) {
                            printf("invalid character for quoted-printable detected\n");
                        } else {
                            /* convert an skip 2 chars */
                            c = (char)hexconv[(int)line_in[ipos+1]]*16 + hexconv[(int)line_in[ipos+2]];
                            ipos+=2;
                        }
                    } else {
                        printf("no chars left!");
                    }
                }
            } else {
                    line_out[opos] = '\0';
                /* if we're out of chars, quit */
                break;
            }
        } else if (( c == '_') && (mode == DECODE_QP_MODE_ISO)) {
            /* RFC2047 says: if you encounter a '_' charactier in the ISO encoding then this must be converted to a space */
          c = ' ';
        }
        /* put in the new character, converted or not */
        line_out[opos] = c;
        opos++;
    }
    /* terminate string */
    line_out[opos]='\0';

    return line_out;
}